

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O1

void __thiscall
icu_63::PatternMap::add
          (PatternMap *this,UnicodeString *basePattern,PtnSkeleton *skeleton,UnicodeString *value,
          UBool skeletonWasSpecified,UErrorCode *status)

{
  short sVar1;
  PtnElem *pPVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint uVar11;
  PtnElem *pPVar13;
  PtnElem *pPVar14;
  PtnSkeleton *pPVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  char16_t *pcVar12;
  UnicodeString *pUVar19;
  
  sVar1 = (basePattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar17 = (basePattern->fUnion).fFields.fLength;
  }
  else {
    iVar17 = (int)sVar1 >> 5;
  }
  if (iVar17 == 0) {
    uVar11 = (uint)CONCAT62((uint6)(ushort)(sVar1 >> 0xf),0xffff);
  }
  else {
    if (((int)sVar1 & 2U) == 0) {
      pcVar12 = (basePattern->fUnion).fFields.fArray;
    }
    else {
      pcVar12 = (basePattern->fUnion).fStackFields.fBuffer;
    }
    uVar11 = (uint)(ushort)*pcVar12;
  }
  *status = U_ZERO_ERROR;
  uVar3 = uVar11 & 0xffff;
  uVar18 = uVar11 - 0x41;
  iVar17 = -0x41;
  if (0x19 < (ushort)uVar18) {
    uVar18 = uVar3 - 0x61;
    iVar17 = -0x47;
    if (0x19 < (ushort)uVar18) {
      *status = U_ILLEGAL_CHARACTER;
      return;
    }
  }
  pUVar19 = (UnicodeString *)(ulong)uVar18;
  pPVar14 = this->boot[iVar17 + uVar3];
  if (pPVar14 == (PtnElem *)0x0) {
    pPVar14 = (PtnElem *)UMemory::operator_new((UMemory *)0xa0,(size_t)pUVar19);
    if (pPVar14 == (PtnElem *)0x0) {
      pPVar14 = (PtnElem *)0x0;
    }
    else {
      PtnElem::PtnElem(pPVar14,basePattern,value);
      pUVar19 = basePattern;
    }
    if ((pPVar14 == (PtnElem *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      pPVar15 = (PtnSkeleton *)UMemory::operator_new((UMemory *)0x90,(size_t)pUVar19);
      if (pPVar15 == (PtnSkeleton *)0x0) {
        pPVar15 = (PtnSkeleton *)0x0;
      }
      else {
        pPVar15->_vptr_PtnSkeleton = (_func_int **)&PTR__PtnSkeleton_0047d868;
        (pPVar15->original).chars[0] = '\0';
        (pPVar15->original).chars[1] = '\0';
        (pPVar15->original).chars[2] = '\0';
        (pPVar15->original).chars[3] = '\0';
        (pPVar15->original).chars[4] = '\0';
        (pPVar15->original).chars[5] = '\0';
        (pPVar15->original).chars[6] = '\0';
        (pPVar15->original).chars[7] = '\0';
        (pPVar15->original).chars[8] = '\0';
        (pPVar15->original).chars[9] = '\0';
        (pPVar15->original).chars[10] = '\0';
        (pPVar15->original).chars[0xb] = '\0';
        (pPVar15->original).chars[0xc] = '\0';
        (pPVar15->original).chars[0xd] = '\0';
        (pPVar15->original).chars[0xe] = '\0';
        (pPVar15->original).chars[0xf] = '\0';
        (pPVar15->original).lengths[0] = '\0';
        (pPVar15->original).lengths[1] = '\0';
        (pPVar15->original).lengths[2] = '\0';
        (pPVar15->original).lengths[3] = '\0';
        (pPVar15->original).lengths[4] = '\0';
        (pPVar15->original).lengths[5] = '\0';
        (pPVar15->original).lengths[6] = '\0';
        (pPVar15->original).lengths[7] = '\0';
        (pPVar15->original).lengths[8] = '\0';
        (pPVar15->original).lengths[9] = '\0';
        (pPVar15->original).lengths[10] = '\0';
        (pPVar15->original).lengths[0xb] = '\0';
        (pPVar15->original).lengths[0xc] = '\0';
        (pPVar15->original).lengths[0xd] = '\0';
        (pPVar15->original).lengths[0xe] = '\0';
        (pPVar15->original).lengths[0xf] = '\0';
        (pPVar15->baseOriginal).chars[0] = '\0';
        (pPVar15->baseOriginal).chars[1] = '\0';
        (pPVar15->baseOriginal).chars[2] = '\0';
        (pPVar15->baseOriginal).chars[3] = '\0';
        (pPVar15->baseOriginal).chars[4] = '\0';
        (pPVar15->baseOriginal).chars[5] = '\0';
        (pPVar15->baseOriginal).chars[6] = '\0';
        (pPVar15->baseOriginal).chars[7] = '\0';
        (pPVar15->baseOriginal).chars[8] = '\0';
        (pPVar15->baseOriginal).chars[9] = '\0';
        (pPVar15->baseOriginal).chars[10] = '\0';
        (pPVar15->baseOriginal).chars[0xb] = '\0';
        (pPVar15->baseOriginal).chars[0xc] = '\0';
        (pPVar15->baseOriginal).chars[0xd] = '\0';
        (pPVar15->baseOriginal).chars[0xe] = '\0';
        (pPVar15->baseOriginal).chars[0xf] = '\0';
        (pPVar15->baseOriginal).lengths[0] = '\0';
        (pPVar15->baseOriginal).lengths[1] = '\0';
        (pPVar15->baseOriginal).lengths[2] = '\0';
        (pPVar15->baseOriginal).lengths[3] = '\0';
        (pPVar15->baseOriginal).lengths[4] = '\0';
        (pPVar15->baseOriginal).lengths[5] = '\0';
        (pPVar15->baseOriginal).lengths[6] = '\0';
        (pPVar15->baseOriginal).lengths[7] = '\0';
        (pPVar15->baseOriginal).lengths[8] = '\0';
        (pPVar15->baseOriginal).lengths[9] = '\0';
        (pPVar15->baseOriginal).lengths[10] = '\0';
        (pPVar15->baseOriginal).lengths[0xb] = '\0';
        (pPVar15->baseOriginal).lengths[0xc] = '\0';
        (pPVar15->baseOriginal).lengths[0xd] = '\0';
        (pPVar15->baseOriginal).lengths[0xe] = '\0';
        (pPVar15->baseOriginal).lengths[0xf] = '\0';
        uVar4 = *(undefined8 *)skeleton->type;
        uVar5 = *(undefined8 *)(skeleton->type + 2);
        uVar6 = *(undefined8 *)(skeleton->type + 4);
        uVar7 = *(undefined8 *)(skeleton->type + 6);
        uVar8 = *(undefined8 *)(skeleton->type + 8);
        uVar9 = *(undefined8 *)(skeleton->type + 10);
        uVar10 = *(undefined8 *)(skeleton->type + 0xe);
        *(undefined8 *)(pPVar15->type + 0xc) = *(undefined8 *)(skeleton->type + 0xc);
        *(undefined8 *)(pPVar15->type + 0xe) = uVar10;
        *(undefined8 *)(pPVar15->type + 8) = uVar8;
        *(undefined8 *)(pPVar15->type + 10) = uVar9;
        *(undefined8 *)(pPVar15->type + 4) = uVar6;
        *(undefined8 *)(pPVar15->type + 6) = uVar7;
        *(undefined8 *)pPVar15->type = uVar4;
        *(undefined8 *)(pPVar15->type + 2) = uVar5;
        uVar4 = *(undefined8 *)((skeleton->original).chars + 8);
        *(undefined8 *)(pPVar15->original).chars = *(undefined8 *)(skeleton->original).chars;
        *(undefined8 *)((pPVar15->original).chars + 8) = uVar4;
        uVar4 = *(undefined8 *)((skeleton->original).lengths + 8);
        *(undefined8 *)(pPVar15->original).lengths = *(undefined8 *)(skeleton->original).lengths;
        *(undefined8 *)((pPVar15->original).lengths + 8) = uVar4;
        uVar4 = *(undefined8 *)((skeleton->baseOriginal).chars + 8);
        *(undefined8 *)(pPVar15->baseOriginal).chars = *(undefined8 *)(skeleton->baseOriginal).chars
        ;
        *(undefined8 *)((pPVar15->baseOriginal).chars + 8) = uVar4;
        uVar4 = *(undefined8 *)((skeleton->baseOriginal).lengths + 8);
        *(undefined8 *)(pPVar15->baseOriginal).lengths =
             *(undefined8 *)(skeleton->baseOriginal).lengths;
        *(undefined8 *)((pPVar15->baseOriginal).lengths + 8) = uVar4;
      }
      LocalPointer<icu_63::PtnSkeleton>::adoptInsteadAndCheckErrorCode
                (&pPVar14->skeleton,pPVar15,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        pPVar14->skeletonWasSpecified = skeletonWasSpecified;
        uVar16 = (ulong)(uVar3 - 0x47);
        if ((ushort)uVar11 < 0x61) {
          uVar16 = (long)(int)(uVar3 - 0x41);
        }
        this->boot[uVar16] = pPVar14;
        return;
      }
    }
  }
  else {
    pUVar19 = basePattern;
    pPVar13 = getDuplicateElem(this,basePattern,skeleton,pPVar14);
    if (pPVar13 != (PtnElem *)0x0) {
      if (this->isDupAllowed == '\0') {
        return;
      }
      icu_63::UnicodeString::operator=(&pPVar13->pattern,value);
      pPVar13->skeletonWasSpecified = skeletonWasSpecified;
      return;
    }
    do {
      pPVar13 = pPVar14;
      pPVar14 = (pPVar13->next).super_LocalPointerBase<icu_63::PtnElem>.ptr;
    } while (pPVar14 != (PtnElem *)0x0);
    pPVar14 = (PtnElem *)UMemory::operator_new((UMemory *)0xa0,(size_t)pUVar19);
    if (pPVar14 == (PtnElem *)0x0) {
      pPVar14 = (PtnElem *)0x0;
    }
    else {
      PtnElem::PtnElem(pPVar14,basePattern,value);
      pUVar19 = basePattern;
    }
    if ((pPVar14 == (PtnElem *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      pPVar15 = (PtnSkeleton *)UMemory::operator_new((UMemory *)0x90,(size_t)pUVar19);
      if (pPVar15 == (PtnSkeleton *)0x0) {
        pPVar15 = (PtnSkeleton *)0x0;
      }
      else {
        pPVar15->_vptr_PtnSkeleton = (_func_int **)&PTR__PtnSkeleton_0047d868;
        (pPVar15->original).chars[0] = '\0';
        (pPVar15->original).chars[1] = '\0';
        (pPVar15->original).chars[2] = '\0';
        (pPVar15->original).chars[3] = '\0';
        (pPVar15->original).chars[4] = '\0';
        (pPVar15->original).chars[5] = '\0';
        (pPVar15->original).chars[6] = '\0';
        (pPVar15->original).chars[7] = '\0';
        (pPVar15->original).chars[8] = '\0';
        (pPVar15->original).chars[9] = '\0';
        (pPVar15->original).chars[10] = '\0';
        (pPVar15->original).chars[0xb] = '\0';
        (pPVar15->original).chars[0xc] = '\0';
        (pPVar15->original).chars[0xd] = '\0';
        (pPVar15->original).chars[0xe] = '\0';
        (pPVar15->original).chars[0xf] = '\0';
        (pPVar15->original).lengths[0] = '\0';
        (pPVar15->original).lengths[1] = '\0';
        (pPVar15->original).lengths[2] = '\0';
        (pPVar15->original).lengths[3] = '\0';
        (pPVar15->original).lengths[4] = '\0';
        (pPVar15->original).lengths[5] = '\0';
        (pPVar15->original).lengths[6] = '\0';
        (pPVar15->original).lengths[7] = '\0';
        (pPVar15->original).lengths[8] = '\0';
        (pPVar15->original).lengths[9] = '\0';
        (pPVar15->original).lengths[10] = '\0';
        (pPVar15->original).lengths[0xb] = '\0';
        (pPVar15->original).lengths[0xc] = '\0';
        (pPVar15->original).lengths[0xd] = '\0';
        (pPVar15->original).lengths[0xe] = '\0';
        (pPVar15->original).lengths[0xf] = '\0';
        (pPVar15->baseOriginal).chars[0] = '\0';
        (pPVar15->baseOriginal).chars[1] = '\0';
        (pPVar15->baseOriginal).chars[2] = '\0';
        (pPVar15->baseOriginal).chars[3] = '\0';
        (pPVar15->baseOriginal).chars[4] = '\0';
        (pPVar15->baseOriginal).chars[5] = '\0';
        (pPVar15->baseOriginal).chars[6] = '\0';
        (pPVar15->baseOriginal).chars[7] = '\0';
        (pPVar15->baseOriginal).chars[8] = '\0';
        (pPVar15->baseOriginal).chars[9] = '\0';
        (pPVar15->baseOriginal).chars[10] = '\0';
        (pPVar15->baseOriginal).chars[0xb] = '\0';
        (pPVar15->baseOriginal).chars[0xc] = '\0';
        (pPVar15->baseOriginal).chars[0xd] = '\0';
        (pPVar15->baseOriginal).chars[0xe] = '\0';
        (pPVar15->baseOriginal).chars[0xf] = '\0';
        (pPVar15->baseOriginal).lengths[0] = '\0';
        (pPVar15->baseOriginal).lengths[1] = '\0';
        (pPVar15->baseOriginal).lengths[2] = '\0';
        (pPVar15->baseOriginal).lengths[3] = '\0';
        (pPVar15->baseOriginal).lengths[4] = '\0';
        (pPVar15->baseOriginal).lengths[5] = '\0';
        (pPVar15->baseOriginal).lengths[6] = '\0';
        (pPVar15->baseOriginal).lengths[7] = '\0';
        (pPVar15->baseOriginal).lengths[8] = '\0';
        (pPVar15->baseOriginal).lengths[9] = '\0';
        (pPVar15->baseOriginal).lengths[10] = '\0';
        (pPVar15->baseOriginal).lengths[0xb] = '\0';
        (pPVar15->baseOriginal).lengths[0xc] = '\0';
        (pPVar15->baseOriginal).lengths[0xd] = '\0';
        (pPVar15->baseOriginal).lengths[0xe] = '\0';
        (pPVar15->baseOriginal).lengths[0xf] = '\0';
        uVar4 = *(undefined8 *)skeleton->type;
        uVar5 = *(undefined8 *)(skeleton->type + 2);
        uVar6 = *(undefined8 *)(skeleton->type + 4);
        uVar7 = *(undefined8 *)(skeleton->type + 6);
        uVar8 = *(undefined8 *)(skeleton->type + 8);
        uVar9 = *(undefined8 *)(skeleton->type + 10);
        uVar10 = *(undefined8 *)(skeleton->type + 0xe);
        *(undefined8 *)(pPVar15->type + 0xc) = *(undefined8 *)(skeleton->type + 0xc);
        *(undefined8 *)(pPVar15->type + 0xe) = uVar10;
        *(undefined8 *)(pPVar15->type + 8) = uVar8;
        *(undefined8 *)(pPVar15->type + 10) = uVar9;
        *(undefined8 *)(pPVar15->type + 4) = uVar6;
        *(undefined8 *)(pPVar15->type + 6) = uVar7;
        *(undefined8 *)pPVar15->type = uVar4;
        *(undefined8 *)(pPVar15->type + 2) = uVar5;
        uVar4 = *(undefined8 *)((skeleton->original).chars + 8);
        *(undefined8 *)(pPVar15->original).chars = *(undefined8 *)(skeleton->original).chars;
        *(undefined8 *)((pPVar15->original).chars + 8) = uVar4;
        uVar4 = *(undefined8 *)((skeleton->original).lengths + 8);
        *(undefined8 *)(pPVar15->original).lengths = *(undefined8 *)(skeleton->original).lengths;
        *(undefined8 *)((pPVar15->original).lengths + 8) = uVar4;
        uVar4 = *(undefined8 *)((skeleton->baseOriginal).chars + 8);
        *(undefined8 *)(pPVar15->baseOriginal).chars = *(undefined8 *)(skeleton->baseOriginal).chars
        ;
        *(undefined8 *)((pPVar15->baseOriginal).chars + 8) = uVar4;
        uVar4 = *(undefined8 *)((skeleton->baseOriginal).lengths + 8);
        *(undefined8 *)(pPVar15->baseOriginal).lengths =
             *(undefined8 *)(skeleton->baseOriginal).lengths;
        *(undefined8 *)((pPVar15->baseOriginal).lengths + 8) = uVar4;
      }
      LocalPointer<icu_63::PtnSkeleton>::adoptInsteadAndCheckErrorCode
                (&pPVar14->skeleton,pPVar15,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        pPVar14->skeletonWasSpecified = skeletonWasSpecified;
        pPVar2 = (pPVar13->next).super_LocalPointerBase<icu_63::PtnElem>.ptr;
        if (pPVar2 != (PtnElem *)0x0) {
          (*pPVar2->_vptr_PtnElem[1])();
        }
        (pPVar13->next).super_LocalPointerBase<icu_63::PtnElem>.ptr = pPVar14;
        return;
      }
    }
  }
  if (pPVar14 == (PtnElem *)0x0) {
    return;
  }
  (*pPVar14->_vptr_PtnElem[1])(pPVar14);
  return;
}

Assistant:

void
PatternMap::add(const UnicodeString& basePattern,
                const PtnSkeleton& skeleton,
                const UnicodeString& value,// mapped pattern value
                UBool skeletonWasSpecified,
                UErrorCode &status) {
    UChar baseChar = basePattern.charAt(0);
    PtnElem *curElem, *baseElem;
    status = U_ZERO_ERROR;

    // the baseChar must be A-Z or a-z
    if ((baseChar >= CAP_A) && (baseChar <= CAP_Z)) {
        baseElem = boot[baseChar-CAP_A];
    }
    else {
        if ((baseChar >=LOW_A) && (baseChar <= LOW_Z)) {
            baseElem = boot[26+baseChar-LOW_A];
         }
         else {
             status = U_ILLEGAL_CHARACTER;
             return;
         }
    }

    if (baseElem == nullptr) {
        LocalPointer<PtnElem> newElem(new PtnElem(basePattern, value), status);
        if (U_FAILURE(status)) {
            return; // out of memory
        }
        newElem->skeleton.adoptInsteadAndCheckErrorCode(new PtnSkeleton(skeleton), status);
        if (U_FAILURE(status)) {
            return; // out of memory
        }
        newElem->skeletonWasSpecified = skeletonWasSpecified;
        if (baseChar >= LOW_A) {
            boot[26 + (baseChar - LOW_A)] = newElem.orphan(); // the boot array now owns the PtnElem.
        }
        else {
            boot[baseChar - CAP_A] = newElem.orphan(); // the boot array now owns the PtnElem.
        }
    }
    if ( baseElem != nullptr ) {
        curElem = getDuplicateElem(basePattern, skeleton, baseElem);

        if (curElem == nullptr) {
            // add new element to the list.
            curElem = baseElem;
            while( curElem -> next != nullptr )
            {
                curElem = curElem->next.getAlias();
            }

            LocalPointer<PtnElem> newElem(new PtnElem(basePattern, value), status);
            if (U_FAILURE(status)) {
                return; // out of memory
            }
            newElem->skeleton.adoptInsteadAndCheckErrorCode(new PtnSkeleton(skeleton), status);
            if (U_FAILURE(status)) {
                return; // out of memory
            }
            newElem->skeletonWasSpecified = skeletonWasSpecified;
            curElem->next.adoptInstead(newElem.orphan());
            curElem = curElem->next.getAlias();
        }
        else {
            // Pattern exists in the list already.
            if ( !isDupAllowed ) {
                return;
            }
            // Overwrite the value.
            curElem->pattern = value;
            // It was a bug that we were not doing the following previously,
            // though that bug hid other problems by making things partly work.
            curElem->skeletonWasSpecified = skeletonWasSpecified;
        }
    }
}